

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.cpp
# Opt level: O3

void formatJSON(string *filename,int indent)

{
  clock_t cVar1;
  clock_t cVar2;
  ostream *poVar3;
  string str;
  Stringifier stringifier;
  Parser parser;
  string local_130;
  Stringifier local_110;
  undefined1 local_108 [136];
  Node local_80;
  
  cVar1 = clock();
  JSON::resolvePath((string *)local_108,filename);
  std::__cxx11::string::operator=((string *)filename,(string *)local_108);
  if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
    operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
  }
  JSON::readFile(&local_130,filename);
  JSON::Parser::Parser((Parser *)local_108,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  local_110.configIndent = 0;
  local_110.current = 0;
  JSON::Parser::parse((Parser *)local_108);
  JSON::Stringifier::stringify_abi_cxx11_(&local_130,&local_110,&local_80,indent);
  JSON::writeFile(filename,&local_130);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Complete! Cost: ",0x10);
  cVar2 = clock();
  poVar3 = std::ostream::_M_insert<double>((double)(cVar2 - cVar1) / 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"s",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  JSON::Parser::~Parser((Parser *)local_108);
  return;
}

Assistant:

void formatJSON(string filename, int indent) {
    clock_t start = clock();
    filename = JSON::resolvePath(filename);
    JSON::Parser parser(JSON::readFile(filename));
    JSON::Stringifier stringifier;
    parser.parse();
    string str = stringifier.stringify(parser.ast, indent);
    JSON::writeFile(filename, str);
    cout << "Complete! Cost: " << (double) (clock() - start) / CLOCKS_PER_SEC << "s" << endl;
}